

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_ObjUpdatePriority(Acb_Ntk_t *p,int iObj)

{
  int *piVar1;
  bool bVar2;
  bool bVar3;
  float *pfVar4;
  Vec_Que_t *pVVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  size_t sVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                  ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((byte)((p->vObjType).pArray[(uint)iObj] - 5U) < 0xfe) {
    if ((p->vLevelD).nSize <= iObj) {
LAB_003abd06:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vLevelD).pArray[(uint)iObj] != 1) {
      if (p->vQue == (Vec_Que_t *)0x0) {
        uVar9 = (p->vObjType).nCap;
        if ((p->vCounts).nCap < (int)uVar9) {
          pfVar4 = (p->vCounts).pArray;
          if (pfVar4 == (float *)0x0) {
            pfVar4 = (float *)malloc((long)(int)uVar9 << 2);
          }
          else {
            pfVar4 = (float *)realloc(pfVar4,(long)(int)uVar9 << 2);
          }
          (p->vCounts).pArray = pfVar4;
          (p->vCounts).nCap = uVar9;
        }
        if (0 < (int)uVar9) {
          memset((p->vCounts).pArray,0,(ulong)uVar9 * 4);
        }
        (p->vCounts).nSize = uVar9;
        pVVar5 = (Vec_Que_t *)calloc(1,0x20);
        pVVar5->nCap = 0x3e9;
        pVVar5->nSize = 1;
        piVar6 = (int *)malloc(0xfa4);
        memset(piVar6,0xff,0xfa4);
        pVVar5->pHeap = piVar6;
        piVar6 = (int *)malloc(0xfa4);
        memset(piVar6,0xff,0xfa4);
        pVVar5->pOrder = piVar6;
        p->vQue = pVVar5;
        if (pVVar5->pCostsFlt != (float **)0x0) {
          __assert_fail("p->pCostsFlt == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
        }
        pVVar5->pCostsFlt = &(p->vCounts).pArray;
      }
      if (((p->vPathD).nSize <= iObj) || ((p->vPathR).nSize <= iObj)) goto LAB_003abd06;
      if ((p->vCounts).nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      iVar7 = (p->vPathR).pArray[(uint)iObj] * (p->vPathD).pArray[(uint)iObj];
      (p->vCounts).pArray[(uint)iObj] = (float)iVar7;
      pVVar5 = p->vQue;
      iVar10 = pVVar5->nCap;
      if ((iObj < iVar10) && (-1 < pVVar5->pOrder[(uint)iObj])) {
        pfVar4 = *pVVar5->pCostsFlt;
        if (pfVar4 == (float *)0x0) {
          fVar16 = (float)iObj;
        }
        else {
          fVar16 = pfVar4[(uint)iObj];
        }
        piVar6 = pVVar5->pOrder;
        uVar9 = piVar6[(uint)iObj];
        uVar11 = (ulong)(int)uVar9;
        if (uVar11 == 0xffffffffffffffff) {
LAB_003abd63:
          __assert_fail("p->pOrder[v] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        piVar1 = pVVar5->pHeap;
        if (piVar1[uVar11] != iObj) {
LAB_003abd82:
          __assert_fail("p->pHeap[i] == v",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        bVar2 = true;
        if (1 < (int)uVar9) {
          uVar12 = uVar11;
          uVar11 = (ulong)uVar9;
          bVar3 = false;
          do {
            bVar2 = bVar3;
            uVar11 = uVar11 >> 1;
            iVar10 = piVar1[uVar11];
            if (pfVar4 == (float *)0x0) {
              fVar17 = (float)iVar10;
            }
            else {
              fVar17 = pfVar4[iVar10];
            }
            uVar9 = (uint)uVar12;
            if (fVar16 <= fVar17) {
              uVar11 = uVar12 & 0xffffffff;
              break;
            }
            piVar1[uVar12 & 0xffffffff] = iVar10;
            piVar6[iVar10] = uVar9;
            bVar2 = true;
            uVar12 = uVar11;
            bVar3 = true;
          } while (3 < uVar9);
          bVar2 = !bVar2;
        }
        iVar10 = (int)uVar11;
        piVar1[iVar10] = iObj;
        piVar6[(uint)iObj] = iVar10;
        if (bVar2) {
          if (pfVar4 == (float *)0x0) {
            fVar16 = (float)iObj;
          }
          else {
            fVar16 = pfVar4[(uint)iObj];
          }
          uVar9 = iVar10 * 2;
          iVar7 = pVVar5->nSize;
          if ((int)uVar9 < iVar7) {
            do {
              iVar10 = (int)uVar11;
              uVar13 = uVar9 | 1;
              if ((int)uVar13 < iVar7) {
                if (pfVar4 == (float *)0x0) {
                  fVar17 = (float)piVar1[(int)uVar9];
                }
                else {
                  fVar17 = pfVar4[piVar1[(int)uVar9]];
                }
                if (pfVar4 == (float *)0x0) {
                  fVar18 = (float)piVar1[(int)uVar13];
                }
                else {
                  fVar18 = pfVar4[piVar1[(int)uVar13]];
                }
                uVar11 = (ulong)uVar9;
                if (fVar17 < fVar18) {
                  uVar11 = (ulong)uVar13;
                }
              }
              else {
                uVar11 = (ulong)uVar9;
              }
              iVar8 = (int)uVar11;
              if (iVar7 <= iVar8) {
                __assert_fail("child < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                              ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
              }
              iVar7 = piVar1[iVar8];
              if (pfVar4 == (float *)0x0) {
                fVar17 = (float)iVar7;
              }
              else {
                fVar17 = pfVar4[iVar7];
              }
              if (fVar17 <= fVar16) break;
              piVar1[iVar10] = iVar7;
              piVar6[iVar7] = iVar10;
              uVar9 = iVar8 * 2;
              iVar7 = pVVar5->nSize;
              iVar10 = iVar8;
            } while ((int)uVar9 < iVar7);
          }
          piVar1[iVar10] = iObj;
          piVar6[(uint)iObj] = iVar10;
        }
      }
      else if (iVar7 != 0) {
        if (iVar10 <= pVVar5->nSize) {
          iVar8 = pVVar5->nSize + 1;
          iVar7 = iVar10 * 2;
          if (iVar8 == iVar7 || SBORROW4(iVar8,iVar7) != iVar8 + iVar10 * -2 < 0) {
            iVar8 = iVar7;
          }
          if (iVar10 < iVar8) {
            lVar14 = (long)iVar8;
            sVar15 = lVar14 * 4;
            if (pVVar5->pHeap == (int *)0x0) {
              piVar6 = (int *)malloc(sVar15);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pHeap,sVar15);
            }
            pVVar5->pHeap = piVar6;
            if (pVVar5->pOrder == (int *)0x0) {
              piVar6 = (int *)malloc(sVar15);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pOrder,sVar15);
            }
            pVVar5->pOrder = piVar6;
            memset(pVVar5->pHeap + pVVar5->nCap,0xff,(lVar14 - pVVar5->nCap) * 4);
            memset(pVVar5->pOrder + pVVar5->nCap,0xff,(lVar14 - pVVar5->nCap) * 4);
            pVVar5->nCap = iVar8;
          }
        }
        iVar10 = pVVar5->nCap;
        if (iVar10 <= iObj) {
          uVar13 = iObj + 1;
          uVar9 = iVar10 * 2;
          if (uVar13 != uVar9 && SBORROW4(uVar13,uVar9) == (int)(uVar13 + iVar10 * -2) < 0) {
            uVar9 = uVar13;
          }
          if (iVar10 < (int)uVar9) {
            sVar15 = (ulong)uVar9 * 4;
            if (pVVar5->pHeap == (int *)0x0) {
              piVar6 = (int *)malloc(sVar15);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pHeap,sVar15);
            }
            pVVar5->pHeap = piVar6;
            sVar15 = (ulong)uVar9 << 2;
            if (pVVar5->pOrder == (int *)0x0) {
              piVar6 = (int *)malloc(sVar15);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pOrder,sVar15);
            }
            pVVar5->pOrder = piVar6;
            memset(pVVar5->pHeap + pVVar5->nCap,0xff,((long)(int)uVar9 - (long)pVVar5->nCap) * 4);
            memset(pVVar5->pOrder + pVVar5->nCap,0xff,((long)(int)uVar9 - (long)pVVar5->nCap) * 4);
            pVVar5->nCap = uVar9;
          }
        }
        iVar10 = pVVar5->nSize;
        if (pVVar5->nCap <= iVar10) {
          __assert_fail("p->nSize < p->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar6 = pVVar5->pOrder;
        if (piVar6[(uint)iObj] != -1) {
          __assert_fail("p->pOrder[v] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar1 = pVVar5->pHeap;
        if (piVar1[iVar10] != -1) {
          __assert_fail("p->pHeap[p->nSize] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar6[(uint)iObj] = iVar10;
        iVar10 = pVVar5->nSize;
        pVVar5->nSize = iVar10 + 1;
        piVar1[iVar10] = iObj;
        pfVar4 = *pVVar5->pCostsFlt;
        if (pfVar4 == (float *)0x0) {
          fVar16 = (float)iObj;
        }
        else {
          fVar16 = pfVar4[(uint)iObj];
        }
        uVar9 = piVar6[(uint)iObj];
        uVar11 = (ulong)(int)uVar9;
        if (uVar11 == 0xffffffffffffffff) goto LAB_003abd63;
        if (piVar1[uVar11] != iObj) goto LAB_003abd82;
        if (1 < (int)uVar9) {
          uVar12 = (ulong)uVar9;
          do {
            uVar13 = (uint)uVar11;
            uVar12 = uVar12 >> 1;
            iVar10 = piVar1[uVar12];
            if (pfVar4 == (float *)0x0) {
              fVar17 = (float)iVar10;
            }
            else {
              fVar17 = pfVar4[iVar10];
            }
            uVar9 = uVar13;
            if (fVar16 <= fVar17) break;
            piVar1[uVar11 & 0xffffffff] = iVar10;
            piVar6[iVar10] = uVar13;
            uVar11 = uVar12;
            uVar9 = (uint)uVar12;
          } while (3 < uVar13);
        }
        piVar1[(int)uVar9] = iObj;
        piVar6[(uint)iObj] = uVar9;
      }
    }
  }
  return;
}

Assistant:

void Acb_ObjUpdatePriority( Acb_Ntk_t * p, int iObj )
{
    int nPaths;
    if ( Acb_ObjIsCio(p, iObj) || Acb_ObjLevelD(p, iObj) == 1 )
        return;
    if ( p->vQue == NULL )
    {
        Acb_NtkCleanObjCounts( p );
        p->vQue = Vec_QueAlloc( 1000 );
        Vec_QueSetPriority( p->vQue, Vec_FltArrayP(&p->vCounts) );
    }
    nPaths = Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj);
    Acb_ObjSetCounts( p, iObj, (float)nPaths );
    if ( Vec_QueIsMember( p->vQue, iObj ) )
    {
//printf( "Updating object %d with count %d\n", iObj, nPaths );
        Vec_QueUpdate( p->vQue, iObj );
    }
    else if ( nPaths )
    {
//printf( "Adding object %d with count %d\n", iObj, nPaths );
        Vec_QuePush( p->vQue, iObj );
    }
}